

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cc
# Opt level: O1

int64_t __thiscall fasttext::Args::getAutotuneModelSize(Args *this)

{
  int iVar1;
  pointer pcVar2;
  char *__nptr;
  size_type sVar3;
  mapped_type *pmVar4;
  int *piVar5;
  long lVar6;
  invalid_argument *this_00;
  undefined8 uVar7;
  int64_t iVar8;
  char lastCharacter;
  string modelSize;
  unordered_map<char,_int,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_int>_>_>
  units;
  char local_c3;
  undefined1 local_c2;
  undefined1 local_c1;
  long local_c0;
  char *local_b8;
  long local_b0;
  char local_a8 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  undefined8 uStack_78;
  undefined8 uStack_70;
  _Hashtable<char,_std::pair<const_char,_int>,_std::allocator<std::pair<const_char,_int>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_68;
  
  local_b8 = local_a8;
  pcVar2 = (this->autotuneModelSize)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b8,pcVar2,pcVar2 + (this->autotuneModelSize)._M_string_length);
  if (local_b0 == 0) {
    iVar8 = -1;
LAB_00125949:
    if (local_b8 != local_a8) {
      operator_delete(local_b8);
    }
    return iVar8;
  }
  uStack_78 = 0x3b9aca0000000067;
  uStack_70 = 0x3b9aca0000000047;
  local_98._M_dataplus._M_p = (char *)0x3e80000006b;
  local_98._M_string_length = 0x3e80000004b;
  local_98.field_2._M_allocated_capacity = 0xf42400000006d;
  local_98.field_2._8_8_ = 0xf42400000004d;
  std::
  _Hashtable<char,std::pair<char_const,int>,std::allocator<std::pair<char_const,int>>,std::__detail::_Select1st,std::equal_to<char>,std::hash<char>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::_Hashtable<std::pair<char_const,int>const*>
            ((_Hashtable<char,std::pair<char_const,int>,std::allocator<std::pair<char_const,int>>,std::__detail::_Select1st,std::equal_to<char>,std::hash<char>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)&local_68,&local_98,&local_68,0,&local_c3,&local_c1,&local_c2);
  local_c3 = local_b8[local_b0 + -1];
  sVar3 = std::
          _Hashtable<char,_std::pair<const_char,_int>,_std::allocator<std::pair<const_char,_int>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::count(&local_68,&local_c3);
  if (sVar3 == 0) {
    local_c0 = 1;
  }
  else {
    pmVar4 = std::__detail::
             _Map_base<char,_std::pair<const_char,_int>,_std::allocator<std::pair<const_char,_int>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<char,_std::pair<const_char,_int>,_std::allocator<std::pair<const_char,_int>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&local_68,&local_c3);
    iVar1 = *pmVar4;
    std::__cxx11::string::substr((ulong)&local_98,(ulong)&local_b8);
    std::__cxx11::string::operator=((string *)&local_b8,(string *)&local_98);
    local_c0 = (long)iVar1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p);
    }
  }
  __nptr = local_b8;
  piVar5 = __errno_location();
  iVar1 = *piVar5;
  *piVar5 = 0;
  lVar6 = strtol(__nptr,(char **)&local_98,10);
  if (local_98._M_dataplus._M_p == __nptr) {
    std::__throw_invalid_argument("stol");
  }
  else {
    if (*piVar5 == 0x22) {
      uVar7 = std::__throw_out_of_range("stol");
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p);
      }
      if ((char)this != '\0') {
        __cxa_free_exception(piVar5);
      }
      std::
      _Hashtable<char,_std::pair<const_char,_int>,_std::allocator<std::pair<const_char,_int>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable(&local_68);
      if (local_b8 != local_a8) {
        operator_delete(local_b8);
      }
      _Unwind_Resume(uVar7);
    }
    if (*piVar5 == 0) {
      *piVar5 = iVar1;
    }
    if ((long)local_98._M_dataplus._M_p - (long)__nptr == local_b0) {
      iVar8 = lVar6 * local_c0;
      std::
      _Hashtable<char,_std::pair<const_char,_int>,_std::allocator<std::pair<const_char,_int>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable(&local_68);
      goto LAB_00125949;
    }
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::operator+(&local_98,"Unable to parse model size ",&this->autotuneModelSize);
  std::invalid_argument::invalid_argument(this_00,(string *)&local_98);
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

int64_t Args::getAutotuneModelSize() const {
  std::string modelSize = autotuneModelSize;
  if (modelSize.empty()) {
    return Args::kUnlimitedModelSize;
  }
  std::unordered_map<char, int> units = {
      {'k', 1000},
      {'K', 1000},
      {'m', 1000000},
      {'M', 1000000},
      {'g', 1000000000},
      {'G', 1000000000},
  };
  uint64_t multiplier = 1;
  char lastCharacter = modelSize.back();
  if (units.count(lastCharacter)) {
    multiplier = units[lastCharacter];
    modelSize = modelSize.substr(0, modelSize.size() - 1);
  }
  uint64_t size = 0;
  size_t nonNumericCharacter = 0;
  bool parseError = false;
  try {
    size = std::stol(modelSize, &nonNumericCharacter);
  } catch (std::invalid_argument&) {
    parseError = true;
  }
  if (!parseError && nonNumericCharacter != modelSize.size()) {
    parseError = true;
  }
  if (parseError) {
    throw std::invalid_argument(
        "Unable to parse model size " + autotuneModelSize);
  }

  return size * multiplier;
}